

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::CommandDiagReset
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aAddr,uint64_t aDiagTlvFlags)

{
  uint64_t aDiagTlvFlags_local;
  string *aAddr_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::CommandDiagReset(const std::string &aAddr, uint64_t aDiagTlvFlags)
{
    UNUSED(aAddr);
    UNUSED(aDiagTlvFlags);
    return Error{};
}